

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<char>::TPZVec(TPZVec<char> *this,TPZVec<char> *rval)

{
  int64_t i;
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_016493a8;
  uVar3 = rval->fNElements;
  this->fNElements = uVar3;
  lVar2 = rval->fNAlloc;
  if (lVar2 == 0) {
    pcVar1 = (char *)operator_new__(uVar3);
    this->fStore = pcVar1;
    for (lVar2 = 0; lVar2 < (long)uVar3; lVar2 = lVar2 + 1) {
      this->fStore[lVar2] = rval->fStore[lVar2];
      uVar3 = this->fNElements;
    }
  }
  else {
    this->fStore = rval->fStore;
    this->fNAlloc = lVar2;
    rval->fStore = (char *)0x0;
    rval->fNAlloc = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}